

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O1

int __thiscall henson::Array::copy(Array *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t __n;
  vector<char,_std::allocator<char>_> *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  void *pvVar3;
  ulong uVar4;
  undefined1 local_39;
  vector<char,_std::allocator<char>_> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  pointer local_28;
  
  local_28 = (pointer)(this->type * this->count);
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>,unsigned_long>
            (&_Stack_30,&local_38,(allocator<std::vector<char,_std::allocator<char>_>_> *)&local_39,
             (unsigned_long *)&local_28);
  _Var2._M_pi = _Stack_30._M_pi;
  pvVar1 = local_38;
  local_38 = (vector<char,_std::allocator<char>_> *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->storage).
            super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->storage).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar1;
  (this->storage).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  pvVar3 = void_ptr(this);
  if (this->count != 0) {
    uVar4 = 0;
    do {
      __n = this->type;
      if (__n != 0) {
        memmove((((this->storage).
                  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + __n * uVar4,
                (void *)(this->stride * uVar4 + (long)pvVar3),__n);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->count);
  }
  local_28 = (((this->storage).
               super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  uVar4 = (ulong)*(index_t *)
                  ((long)&(this->address).impl_.
                          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>
                          .
                          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                  + 8);
  if (uVar4 != 0xffffffff) {
    local_38 = (vector<char,_std::allocator<char>_> *)&local_28;
    (**(code **)(mpark::detail::visitation::
                 fmatrix<mpark::detail::visitation::variant::value_visitor<henson::Array::replace_ptr>&&,mpark::detail::base<(mpark::detail::Trait)0,void*,float*,double*,int*,long*>&>
                 ::value + uVar4 * 8))(&local_38,this);
    this->stride = this->type;
    return (int)this->type;
  }
  mpark::throw_bad_variant_access();
}

Assistant:

void    copy()
    {
        storage = std::make_shared<std::vector<char>>(count*type);
        char* char_ptr = static_cast<char*>(void_ptr());
        for (size_t i = 0; i < count; ++i)
            std::copy(char_ptr + i*stride, char_ptr + i*stride + type, storage->data() + i*type);
        visit(replace_ptr {storage->data()}, address);
        stride = type;
    }